

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Labels.cpp
# Opt level: O0

int __thiscall Labels::update(Labels *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  long in_RDI;
  uint i;
  int cnt;
  uint local_10;
  int local_c;
  
  local_c = 0;
  if ((DebugFlag) && (bVar1 = isCurrentDebugType(_i), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"update");
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"current size: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,current_size);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  for (local_10 = 0; local_10 < current_size; local_10 = local_10 + 1) {
    if ((labels_activated[local_10] & 1U) != 0) {
      *(int *)(in_RDI + (ulong)local_10 * 4) = *(int *)(in_RDI + (ulong)local_10 * 4) + 1;
      local_c = local_c + 1;
    }
    if (((DebugFlag & 1U) != 0) && (bVar1 = isCurrentDebugType(_i), bVar1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"update");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"activated[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2,"] ? ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(labels_activated[local_10] & 1));
      poVar2 = std::operator<<(poVar2," counter? ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,*(uint *)(in_RDI + (ulong)local_10 * 4));
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((DebugFlag & 1U) != 0) && (bVar1 = isCurrentDebugType(_i), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"update");
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"ENDING");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return local_c;
}

Assistant:

int Labels::update(){
    // For each activated labels, increase counter.
    int cnt = 0;
    DEBUGG("labels", "current size: " << current_size);
    for(unsigned int i=0 ; i<current_size ; i++){
        if(labels_activated[i]){
            labels_counter[i]++;
            cnt++;
        }
        DEBUGG("labels","activated["<<
                i << "] ? "<< labels_activated[i]<<
                " counter? "<<labels_counter[i]);
    }
    DEBUGINFO("ENDING");
    return cnt;
}